

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.hpp
# Opt level: O0

size_t __thiscall
perior::
rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
::choose_leaf(rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
              *this,indexable_type *entry)

{
  bool bVar1;
  size_t sVar2;
  reference prVar3;
  reference puVar4;
  scalar_type *psVar5;
  double *pdVar6;
  cubic_periodic_boundary<perior::point<double,_2UL>_> *in_R8;
  double dVar7;
  scalar_type diff_area;
  type_conflict1 local_e0;
  scalar_type area_expanded;
  scalar_type area_initial;
  const_iterator e;
  const_iterator i;
  node_type *node;
  scalar_type area_min;
  scalar_type diff_area_min;
  size_t node_idx;
  undefined1 local_90 [8];
  node_type n;
  indexable_type *entry_local;
  rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  *this_local;
  
  n.box.radius.values_.elems[1] = (double)entry;
  if (this->root_ == 0xffffffffffffffff) {
    detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>::rtree_node
              ((rtree_node<perior::point<double,_2UL>,_2UL,_6UL> *)local_90,true,0xffffffffffffffff)
    ;
    rectangle<perior::point<double,_2UL>_>::operator=
              ((rectangle<perior::point<double,_2UL>_> *)
               &n.entry.
                super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                .m_holder.m_size,
               (rectangle<perior::point<double,_2UL>_> *)n.box.radius.values_.elems[1]);
    sVar2 = add_node(this,(node_type *)local_90);
    this->root_ = sVar2;
    this_local = (rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                  *)this->root_;
    detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>::~rtree_node
              ((rtree_node<perior::point<double,_2UL>,_2UL,_6UL> *)local_90);
  }
  else {
    diff_area_min = (scalar_type)this->root_;
    while (prVar3 = boost::container::
                    vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
                    ::at(&this->tree_,(size_type)diff_area_min),
          ((prVar3->is_leaf ^ 0xffU) & 1) != 0) {
      area_min = std::numeric_limits<double>::max();
      node = (node_type *)std::numeric_limits<double>::max();
      boost::container::
      vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
      ::at(&this->tree_,(size_type)diff_area_min);
      boost::container::
      vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
      ::begin((vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
               *)&e);
      boost::container::
      vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
      ::end((vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
             *)&area_initial);
      while (bVar1 = boost::container::operator!=
                               (&e,(vec_iterator<unsigned_long_*,_true> *)&area_initial), bVar1) {
        puVar4 = boost::container::vec_iterator<unsigned_long_*,_true>::operator*(&e);
        prVar3 = boost::container::
                 vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
                 ::at(&this->tree_,*puVar4);
        area_expanded =
             area<perior::point<double,2ul>,perior::cubic_periodic_boundary>
                       (&prVar3->box,&this->boundary_);
        puVar4 = boost::container::vec_iterator<unsigned_long_*,_true>::operator*(&e);
        prVar3 = boost::container::
                 vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
                 ::at(&this->tree_,*puVar4);
        expand<perior::point<double,2ul>>
                  ((type *)&diff_area,(perior *)&prVar3->box,
                   (rectangle<perior::point<double,_2UL>_> *)n.box.radius.values_.elems[1],
                   (rectangle<perior::point<double,_2UL>_> *)&this->boundary_,in_R8);
        local_e0 = area<perior::point<double,2ul>,perior::cubic_periodic_boundary>
                             ((rectangle<perior::point<double,_2UL>_> *)&diff_area,&this->boundary_)
        ;
        dVar7 = local_e0 - area_expanded;
        if (dVar7 < area_min) {
LAB_00127d88:
          psVar5 = (scalar_type *)
                   boost::container::vec_iterator<unsigned_long_*,_true>::operator*(&e);
          diff_area_min = *psVar5;
          area_min = dVar7;
          pdVar6 = std::min<double>((double *)&node,&local_e0);
          node = (node_type *)*pdVar6;
        }
        else if (((dVar7 == area_min) && (!NAN(dVar7) && !NAN(area_min))) &&
                (local_e0 < (double)node)) goto LAB_00127d88;
        boost::container::vec_iterator<unsigned_long_*,_true>::operator++(&e);
      }
    }
    this_local = (rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                  *)diff_area_min;
  }
  return (size_t)this_local;
}

Assistant:

std::size_t choose_leaf(const indexable_type& entry)
    {
        if(this->root_ == nil)
        {
            node_type n(true, nil);
            n.box = make_aabb(entry);
            this->root_ = this->add_node(n);

            return this->root_;
        }

        // choose a leaf to insert
        // so if root is a leaf, return it
        std::size_t node_idx = this->root_;
        while(!(this->tree_.at(node_idx).is_leaf))
        {
            // find minimum expansion
            scalar_type diff_area_min = std::numeric_limits<scalar_type>::max();
            scalar_type area_min      = std::numeric_limits<scalar_type>::max();

            const node_type& node = this->tree_.at(node_idx);
            for(typename node_type::const_iterator
                    i(node.entry.begin()), e(node.entry.end()); i != e; ++i)
            {
                const scalar_type area_initial
                    = area(this->tree_.at(*i).box, this->boundary_);

                const scalar_type area_expanded
                    = area(expand(this->tree_.at(*i).box, entry, this->boundary_),
                           this->boundary_);

                const scalar_type diff_area = area_expanded - area_initial;
                if((diff_area <  diff_area_min) ||
                   (diff_area == diff_area_min  && area_expanded < area_min))
                {
                    node_idx = *i;
                    diff_area_min = diff_area;
                    area_min      = std::min(area_min, area_expanded);
                }
            }
        }
        return node_idx;
    }